

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool libaom_examples::anon_unknown_0::parse_line
               (ifstream *file,int min_indent,bool is_list,int *indent,bool *has_list_prefix,
               int *line_idx,string *field_name,ParsedValue *value,bool *syntax_error)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  _Ios_Seekdir _Var4;
  istream *piVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  bool bVar9;
  char *pcVar10;
  double dVar11;
  string value_str;
  char *endptr;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [20];
  undefined4 local_7c;
  int local_78;
  int local_74;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,is_list);
  local_74 = min_indent;
  std::__cxx11::string::_M_replace
            ((ulong)field_name,0,(char *)field_name->_M_string_length,0xd8d041);
  *syntax_error = false;
  value->type_ = kNone;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_78 = *indent;
LAB_0081d3e5:
  _Var4 = std::istream::tellg();
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)file,(string *)&local_a0,cVar3);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    lVar6 = std::__cxx11::string::find((char)(string *)&local_a0,0x23);
    if (lVar6 != -1) {
      std::__cxx11::string::resize((ulong)&local_a0,(char)lVar6);
    }
    while (local_98 != 0) {
      if (local_a0[local_98 + -1] != ' ') {
        *indent = 0;
        *has_list_prefix = false;
        if ((int)(uint)local_98 < 1) goto LAB_0081d47a;
        uVar8 = 0;
        goto LAB_0081d4de;
      }
      std::__cxx11::string::resize((ulong)&local_a0,(char)local_98 + -1);
    }
    *indent = 0;
    *has_list_prefix = false;
    goto LAB_0081d47a;
  }
LAB_0081d545:
  bVar9 = false;
LAB_0081d547:
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return bVar9;
LAB_0081d4de:
  do {
    cVar3 = local_a0[uVar8];
    if ((cVar3 != '\t') && (cVar3 != ' ')) {
      if (cVar3 != '-') break;
      *has_list_prefix = true;
    }
    uVar8 = uVar8 + 1;
    *indent = (int)uVar8;
  } while (((uint)local_98 & 0x7fffffff) != uVar8);
LAB_0081d47a:
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a0);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_70);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_98 == 0) {
    *line_idx = *line_idx + 1;
    goto LAB_0081d3e5;
  }
  if ((*indent < local_74) || (*indent < local_78 && 0 < local_78)) {
    plVar7 = (long *)std::istream::seekg((long)file,_Var4);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
      _GLOBAL__N_1::parse_line((_GLOBAL__N_1 *)syntax_error);
    }
    goto LAB_0081d545;
  }
  iVar1 = *line_idx;
  *line_idx = iVar1 + 1U;
  if ((local_78 < 0) || (local_78 == *indent)) {
    if (*has_list_prefix != true || (char)local_7c != '\0') {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_a0,local_a0 + local_98);
      lVar6 = std::__cxx11::string::find((char)&local_a0,0x3a);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_a0);
        std::__cxx11::string::operator=((string *)field_name,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_a0);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      bVar9 = true;
      if (local_68 != 0) {
        lVar6 = std::__cxx11::string::find((char)&local_a0,0x2e);
        if (lVar6 == -1) {
          lVar6 = strtol(local_70,local_50,10);
          value->type_ = kInteger;
          value->int_value_ = lVar6;
          if (*local_50[0] == '\0') goto LAB_0081d6d6;
          uVar2 = *line_idx;
          pcVar10 = "Error: Failed to parse integer from \'%s\' at line %d\n";
        }
        else {
          dVar11 = strtod(local_70,local_50);
          value->type_ = kFloatingPoint;
          value->double_value_ = dVar11;
          if (*local_50[0] == '\0') goto LAB_0081d6d6;
          uVar2 = *line_idx;
          pcVar10 = "Error: Failed to parse floating point value from \'%s\' at line %d\n";
        }
        fprintf(_stderr,pcVar10,local_70,(ulong)uVar2);
        *syntax_error = true;
        bVar9 = false;
      }
LAB_0081d6d6:
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      goto LAB_0081d547;
    }
    pcVar10 = "Error: Unexpected list item at line %d\n";
  }
  else {
    pcVar10 = "Error: Bad indentation at line %d\n";
  }
  bVar9 = false;
  fprintf(_stderr,pcVar10,(ulong)(iVar1 + 1U));
  *syntax_error = true;
  goto LAB_0081d547;
}

Assistant:

bool parse_line(std::ifstream &file, int min_indent, bool is_list, int *indent,
                bool *has_list_prefix, int *line_idx, std::string *field_name,
                ParsedValue *value, bool *syntax_error) {
  *field_name = "";
  *syntax_error = false;
  value->Clear();
  std::string line;
  std::ifstream::pos_type prev_file_position;
  const int prev_indent = *indent;
  while (prev_file_position = file.tellg(), std::getline(file, line)) {
    cleanup_line(line);
    get_indent(line, indent, has_list_prefix);
    line = line.substr(*indent);  // skip indentation
    // If the line is indented less than 'min_indent', it belongs to the outer
    // object, and parsing should go back to the previous function in the stack.
    if (!line.empty() &&
        (*indent < min_indent || (prev_indent > 0 && *indent < prev_indent))) {
      // Undo reading the last line.
      if (!file.seekg(prev_file_position, std::ios::beg)) {
        fprintf(stderr, "Failed to seek to previous file position\n");
        *syntax_error = true;
        return false;
      }
      return false;
    }

    ++(*line_idx);
    if (line.empty()) continue;

    if (prev_indent >= 0 && prev_indent != *indent) {
      fprintf(stderr, "Error: Bad indentation at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }
    if (*has_list_prefix && !is_list) {
      fprintf(stderr, "Error: Unexpected list item at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }

    std::string value_str = line;
    size_t colon_pos = line.find(':');
    if (colon_pos != std::string::npos) {
      *field_name = line.substr(0, colon_pos);
      value_str = line.substr(colon_pos + 1);
    }
    if (!value_str.empty()) {
      char *endptr;
      if (line.find('.') != std::string::npos) {
        value->SetFloatingPointValue(strtod(value_str.c_str(), &endptr));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse floating point value from '%s' at "
                  "line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      } else {
        value->SetIntegerValue(strtol(value_str.c_str(), &endptr, 10));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse integer from '%s' at line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      }
    }
    return true;
  }
  return false;  // Reached the end of the file.
}